

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O0

int test_cube(void)

{
  int iVar1;
  MTBDD vars_00;
  BDD BVar2;
  BDD BVar3;
  BDD BVar4;
  MTBDD MVar5;
  double dVar6;
  ulong local_c0;
  size_t count;
  MTBDD leaf;
  BDD BStack_a8;
  uint8_t arr [6];
  BDD c;
  undefined1 local_98;
  undefined1 local_97;
  uint8_t local_96 [30];
  BDD local_78;
  BDD t2;
  BDD local_68;
  BDD t1;
  BDD picked;
  BDD picked_single;
  BDD bdd;
  int local_40;
  int j;
  int i;
  uint8_t check [6];
  uint8_t cube [6];
  BDDSET vars;
  
  stack0xffffffffffffffd0 = 0x200000001;
  vars_00 = mtbdd_set_from_array((uint32_t *)(check + 4),6);
  for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
    iVar1 = rng(0,3);
    check[(long)local_40 + -2] = (uint8_t)iVar1;
  }
  picked_single = sylvan_cube(vars_00,(uint8_t *)((long)&i + 2));
  sylvan_sat_one(picked_single,vars_00,(uint8_t *)&j);
  for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
    if ((check[(long)local_40 + -2] != *(uint8_t *)((long)&j + (long)local_40)) &&
       ((check[(long)local_40 + -2] != '\x02' || (*(char *)((long)&j + (long)local_40) != '\0')))) {
      fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
              ,199,"int test_cube()","cube[i] == check[i] || (cube[i] == 2 && check[i] == 0)");
      return 1;
    }
  }
  picked = sylvan_sat_single(picked_single,vars_00);
  BVar2 = sylvan_and_RUN(picked,picked_single,0);
  iVar1 = testEqual(BVar2,picked);
  if (iVar1 == 0) {
    fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c",
            0xca,"int test_cube()","testEqual(sylvan_and(picked_single, bdd), picked_single)");
    vars._4_4_ = 1;
  }
  else {
    dVar6 = sylvan_satcount_RUN(picked,vars_00,0);
    if ((dVar6 != 1.0) || (NAN(dVar6))) {
      __assert_fail("sylvan_satcount(picked_single, vars)==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                    ,0xcb,"int test_cube()");
    }
    t1 = sylvan_sat_one_bdd(picked_single);
    BVar2 = sylvan_and_RUN(t1,picked_single,0);
    iVar1 = testEqual(BVar2,t1);
    if (iVar1 == 0) {
      fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
              ,0xce,"int test_cube()","testEqual(sylvan_and(picked, bdd), picked)");
      vars._4_4_ = 1;
    }
    else {
      t2._2_1_ = 1;
      t2._3_1_ = 1;
      t2._4_1_ = 2;
      t2._5_1_ = 2;
      t2._6_1_ = 0;
      t2._7_1_ = 0;
      local_68 = sylvan_cube(vars_00,(uint8_t *)((long)&t2 + 2));
      local_96[0x18] = 1;
      local_96[0x19] = 1;
      local_96[0x1a] = 1;
      local_96[0x1b] = 0;
      local_96[0x1c] = 0;
      local_96[0x1d] = 2;
      local_78 = sylvan_cube(vars_00,local_96 + 0x18);
      builtin_memcpy(local_96 + 0x12,"\x01\x01\x01",4);
      local_96[0x16] = 0;
      local_96[0x17] = 2;
      BVar2 = sylvan_union_cube_RUN(local_68,vars_00,local_96 + 0x12);
      BVar3 = sylvan_not(local_68);
      BVar4 = sylvan_not(local_78);
      BVar3 = sylvan_and_RUN(BVar3,BVar4,0);
      BVar3 = sylvan_not(BVar3);
      iVar1 = testEqual(BVar2,BVar3);
      if (iVar1 == 0) {
        fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                ,0xd2,"int test_cube()",
                "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,2})), sylvan_or(t1, t2))"
               );
        vars._4_4_ = 1;
      }
      else {
        builtin_memcpy(local_96 + 0xc,"\x02\x02\x02\x01\x01",6);
        local_78 = sylvan_cube(vars_00,local_96 + 0xc);
        builtin_memcpy(local_96 + 6,"\x02\x02\x02\x01\x01",6);
        BVar2 = sylvan_union_cube_RUN(local_68,vars_00,local_96 + 6);
        BVar3 = sylvan_not(local_68);
        BVar4 = sylvan_not(local_78);
        BVar3 = sylvan_and_RUN(BVar3,BVar4,0);
        BVar3 = sylvan_not(BVar3);
        iVar1 = testEqual(BVar2,BVar3);
        if (iVar1 == 0) {
          fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                  ,0xd4,"int test_cube()",
                  "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){2,2,2,1,1,0})), sylvan_or(t1, t2))"
                 );
          vars._4_4_ = 1;
        }
        else {
          builtin_memcpy(local_96,"\x01\x01\x01",4);
          local_96[4] = 0;
          local_96[5] = 0;
          local_78 = sylvan_cube(vars_00,local_96);
          c._4_1_ = 1;
          c._5_1_ = 1;
          c._6_1_ = 1;
          c._7_1_ = 0;
          local_98 = 0;
          local_97 = 0;
          BVar2 = sylvan_union_cube_RUN(local_68,vars_00,(uint8_t *)((long)&c + 4));
          BVar3 = sylvan_not(local_68);
          BVar4 = sylvan_not(local_78);
          BVar3 = sylvan_and_RUN(BVar3,BVar4,0);
          BVar3 = sylvan_not(BVar3);
          iVar1 = testEqual(BVar2,BVar3);
          if (iVar1 == 0) {
            fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                    ,0xd6,"int test_cube()",
                    "testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,0})), sylvan_or(t1, t2))"
                   );
            vars._4_4_ = 1;
          }
          else {
            picked_single = make_random(1,0x10);
            for (bdd._4_4_ = 0; bdd._4_4_ < 10; bdd._4_4_ = bdd._4_4_ + 1) {
              for (local_40 = 0; local_40 < 6; local_40 = local_40 + 1) {
                iVar1 = rng(0,3);
                check[(long)local_40 + -2] = (uint8_t)iVar1;
              }
              BStack_a8 = sylvan_cube(vars_00,(uint8_t *)((long)&i + 2));
              BVar2 = sylvan_union_cube_RUN(picked_single,vars_00,(uint8_t *)((long)&i + 2));
              BVar3 = sylvan_not(picked_single);
              BVar4 = sylvan_not(BStack_a8);
              BVar3 = sylvan_and_RUN(BVar3,BVar4,0);
              BVar3 = sylvan_not(BVar3);
              if (BVar2 != BVar3) {
                fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                        ,0xdc,"int test_cube()",
                        "sylvan_union_cube(bdd, vars, cube) == sylvan_or(bdd, c)");
                return 1;
              }
            }
            for (local_40 = 0; local_40 < 10; local_40 = local_40 + 1) {
              t1 = sylvan_sat_one_bdd(picked_single);
              BVar2 = sylvan_and_RUN(t1,picked_single,0);
              iVar1 = testEqual(BVar2,t1);
              if (iVar1 == 0) {
                fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                        ,0xe1,"int test_cube()","testEqual(sylvan_and(picked, bdd), picked)");
                return 1;
              }
            }
            MVar5 = mtbdd_enum_all_first
                              (0x8000000000000000,vars_00,(uint8_t *)((long)&leaf + 2),
                               (mtbdd_enum_filter_cb)0x0);
            if (MVar5 == 0x8000000000000000) {
              MVar5 = mtbdd_enum_all_first
                                (0x8000000000000000,vars_00,(uint8_t *)((long)&leaf + 2),
                                 (mtbdd_enum_filter_cb)0x0);
              if (MVar5 == 0x8000000000000000) {
                if ((((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) && (leaf._4_1_ == '\0')) &&
                   (((leaf._5_1_ == '\0' && (leaf._6_1_ == '\0')) && (leaf._7_1_ == '\0')))) {
                  MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                              (uint8_t *)((long)&leaf + 2),(mtbdd_enum_filter_cb)0x0
                                             );
                  if (MVar5 == 0x8000000000000000) {
                    if (((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                       ((leaf._4_1_ == '\0' &&
                        (((leaf._5_1_ == '\0' && (leaf._6_1_ == '\0')) && (leaf._7_1_ == '\x01')))))
                       ) {
                      MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                                  (uint8_t *)((long)&leaf + 2),
                                                  (mtbdd_enum_filter_cb)0x0);
                      if (MVar5 == 0x8000000000000000) {
                        if (((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                           (((leaf._4_1_ == '\0' && ((leaf._5_1_ == '\0' && (leaf._6_1_ == '\x01')))
                             ) && (leaf._7_1_ == '\0')))) {
                          MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                                      (uint8_t *)((long)&leaf + 2),
                                                      (mtbdd_enum_filter_cb)0x0);
                          if (MVar5 == 0x8000000000000000) {
                            if (((((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                                 (leaf._4_1_ == '\0')) &&
                                ((leaf._5_1_ == '\0' && (leaf._6_1_ == '\x01')))) &&
                               (leaf._7_1_ == '\x01')) {
                              MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                                          (uint8_t *)((long)&leaf + 2),
                                                          (mtbdd_enum_filter_cb)0x0);
                              if (MVar5 == 0x8000000000000000) {
                                if (((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                                   ((leaf._4_1_ == '\0' &&
                                    (((leaf._5_1_ == '\x01' && (leaf._6_1_ == '\0')) &&
                                     (leaf._7_1_ == '\0')))))) {
                                  MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                                              (uint8_t *)((long)&leaf + 2),
                                                              (mtbdd_enum_filter_cb)0x0);
                                  if (MVar5 == 0x8000000000000000) {
                                    if ((((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                                        ((leaf._4_1_ == '\0' &&
                                         ((leaf._5_1_ == '\x01' && (leaf._6_1_ == '\0')))))) &&
                                       (leaf._7_1_ == '\x01')) {
                                      MVar5 = mtbdd_enum_all_next(0x8000000000000000,vars_00,
                                                                  (uint8_t *)((long)&leaf + 2),
                                                                  (mtbdd_enum_filter_cb)0x0);
                                      if (MVar5 == 0x8000000000000000) {
                                        if ((((leaf._2_1_ == '\0') && (leaf._3_1_ == '\0')) &&
                                            (leaf._4_1_ == '\0')) &&
                                           (((leaf._5_1_ == '\x01' && (leaf._6_1_ == '\x01')) &&
                                            (leaf._7_1_ == '\0')))) {
                                          mtbdd_enum_all_first
                                                    (0x8000000000000000,vars_00,
                                                     (uint8_t *)((long)&leaf + 2),
                                                     (mtbdd_enum_filter_cb)0x0);
                                          local_c0 = 1;
                                          while (MVar5 = mtbdd_enum_all_next(0x8000000000000000,
                                                                             vars_00,(uint8_t *)
                                                                                     ((long)&leaf +
                                                                                     2),
                                                                             (mtbdd_enum_filter_cb)
                                                                             0x0), MVar5 != 0) {
                                            if (0x3f < local_c0) {
                                              fprintf(_stderr,
                                                  "file %s: line %d (%s): precondition `%s\' failed.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                                  ,0xfa,"int test_cube()","count < 64");
                                              return 1;
                                            }
                                            local_c0 = local_c0 + 1;
                                          }
                                          if (local_c0 == 0x40) {
                                            vars._4_4_ = 0;
                                          }
                                          else {
                                            fprintf(_stderr,
                                                  "file %s: line %d (%s): precondition `%s\' failed.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                                  ,0xfd,"int test_cube()","count == 64");
                                            vars._4_4_ = 1;
                                          }
                                        }
                                        else {
                                          fprintf(_stderr,
                                                  "file %s: line %d (%s): precondition `%s\' failed.\n"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                                  ,0xf5,"int test_cube()",
                                                  "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 1 && arr[5] == 0"
                                                 );
                                          vars._4_4_ = 1;
                                        }
                                      }
                                      else {
                                        fprintf(_stderr,
                                                "file %s: line %d (%s): precondition `%s\' failed.\n"
                                                ,
                                                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                                ,0xf4,"int test_cube()",
                                                "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true"
                                               );
                                        vars._4_4_ = 1;
                                      }
                                    }
                                    else {
                                      fprintf(_stderr,
                                              "file %s: line %d (%s): precondition `%s\' failed.\n",
                                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                              ,0xf3,"int test_cube()",
                                              "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 1"
                                             );
                                      vars._4_4_ = 1;
                                    }
                                  }
                                  else {
                                    fprintf(_stderr,
                                            "file %s: line %d (%s): precondition `%s\' failed.\n",
                                            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                            ,0xf2,"int test_cube()",
                                            "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true"
                                           );
                                    vars._4_4_ = 1;
                                  }
                                }
                                else {
                                  fprintf(_stderr,
                                          "file %s: line %d (%s): precondition `%s\' failed.\n",
                                          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                          ,0xf1,"int test_cube()",
                                          "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 0"
                                         );
                                  vars._4_4_ = 1;
                                }
                              }
                              else {
                                fprintf(_stderr,
                                        "file %s: line %d (%s): precondition `%s\' failed.\n",
                                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                        ,0xf0,"int test_cube()",
                                        "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true"
                                       );
                                vars._4_4_ = 1;
                              }
                            }
                            else {
                              fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                      ,0xef,"int test_cube()",
                                      "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 1"
                                     );
                              vars._4_4_ = 1;
                            }
                          }
                          else {
                            fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                    ,0xee,"int test_cube()",
                                    "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true"
                                   );
                            vars._4_4_ = 1;
                          }
                        }
                        else {
                          fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                  ,0xed,"int test_cube()",
                                  "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 0"
                                 );
                          vars._4_4_ = 1;
                        }
                      }
                      else {
                        fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                                ,0xec,"int test_cube()",
                                "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true");
                        vars._4_4_ = 1;
                      }
                    }
                    else {
                      fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                              ,0xeb,"int test_cube()",
                              "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 1"
                             );
                      vars._4_4_ = 1;
                    }
                  }
                  else {
                    fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                            ,0xea,"int test_cube()",
                            "mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true");
                    vars._4_4_ = 1;
                  }
                }
                else {
                  fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                          ,0xe9,"int test_cube()",
                          "arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 0"
                         );
                  vars._4_4_ = 1;
                }
              }
              else {
                fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                        ,0xe8,"int test_cube()",
                        "mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL) == mtbdd_true");
                vars._4_4_ = 1;
              }
            }
            else {
              fprintf(_stderr,"file %s: line %d (%s): precondition `%s\' failed.\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                      ,0xe7,"int test_cube()","leaf == mtbdd_true");
              vars._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  return vars._4_4_;
}

Assistant:

int
test_cube()
{
    const BDDSET vars = sylvan_set_fromarray(((BDDVAR[]){1,2,3,4,6,8}), 6);

    uint8_t cube[6], check[6];
    int i, j;
    for (i=0;i<6;i++) cube[i] = rng(0,3);
    BDD bdd = sylvan_cube(vars, cube);

    sylvan_sat_one(bdd, vars, check);
    for (i=0; i<6;i++) test_assert(cube[i] == check[i] || (cube[i] == 2 && check[i] == 0));

    BDD picked_single = sylvan_pick_single_cube(bdd, vars);
    test_assert(testEqual(sylvan_and(picked_single, bdd), picked_single));
    assert(sylvan_satcount(picked_single, vars)==1);

    BDD picked = sylvan_pick_cube(bdd);
    test_assert(testEqual(sylvan_and(picked, bdd), picked));

    BDD t1 = sylvan_cube(vars, ((uint8_t[]){1,1,2,2,0,0}));
    BDD t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,2}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,2})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){2,2,2,1,1,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){2,2,2,1,1,0})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,0})), sylvan_or(t1, t2)));

    bdd = make_random(1, 16);
    for (j=0;j<10;j++) {
        for (i=0;i<6;i++) cube[i] = rng(0,3);
        BDD c = sylvan_cube(vars, cube);
        test_assert(sylvan_union_cube(bdd, vars, cube) == sylvan_or(bdd, c));
    }

    for (i=0;i<10;i++) {
        picked = sylvan_pick_cube(bdd);
        test_assert(testEqual(sylvan_and(picked, bdd), picked));
    }

    // simple test for mtbdd_enum_all
    uint8_t arr[6];
    MTBDD leaf = mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    test_assert(leaf == mtbdd_true);
    test_assert(mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 1 && arr[5] == 0);

    mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    size_t count = 1;
    while (mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) != mtbdd_false) {
        test_assert(count < 64);
        count++;
    }
    test_assert(count == 64);

    return 0;
}